

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TinyNPY.cpp
# Opt level: O0

LPCSTR __thiscall NpyArray::LoadNPY(NpyArray *this,FILE *fp)

{
  uchar *__ptr;
  size_t sVar1;
  size_t sVar2;
  EVP_PKEY_CTX *ctx;
  size_t nread;
  LPCSTR ret;
  FILE *fp_local;
  NpyArray *this_local;
  
  Release(this);
  ctx = (EVP_PKEY_CTX *)&this->shape;
  this_local = (NpyArray *)
               ParseHeaderNPY(fp,(shape_t *)ctx,&this->wordSize,&this->type,&this->fortranOrder);
  if (this_local == (NpyArray *)0x0) {
    init(this,ctx);
    __ptr = Data<unsigned_char>(this);
    sVar1 = SizeBytes(this);
    sVar2 = fread(__ptr,1,sVar1,(FILE *)fp);
    sVar1 = SizeBytes(this);
    if (sVar2 == sVar1) {
      this_local = (NpyArray *)0x0;
    }
    else {
      this_local = (NpyArray *)anon_var_dwarf_148;
    }
  }
  return (LPCSTR)this_local;
}

Assistant:

LPCSTR NpyArray::LoadNPY(FILE* fp)
{
	Release();
	LPCSTR ret = ParseHeaderNPY(fp, shape, wordSize, type, fortranOrder);
	if (ret != NULL)
		return ret;
	init();
	const size_t nread = fread(Data(), 1, SizeBytes(), fp);
	if (nread != SizeBytes())
		return "error: failed fread";
	return NULL;
}